

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AppendSpace(StrAccum *pAccum,int N)

{
  int local_14;
  int N_local;
  StrAccum *pAccum_local;
  
  for (local_14 = N; 0x1c < local_14; local_14 = local_14 + -0x1d) {
    sqlite3StrAccumAppend(pAccum,"                             ",0x1d);
  }
  if (0 < local_14) {
    sqlite3StrAccumAppend(pAccum,"                             ",local_14);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AppendSpace(StrAccum *pAccum, int N){
  static const char zSpaces[] = "                             ";
  while( N>=(int)sizeof(zSpaces)-1 ){
    sqlite3StrAccumAppend(pAccum, zSpaces, sizeof(zSpaces)-1);
    N -= sizeof(zSpaces)-1;
  }
  if( N>0 ){
    sqlite3StrAccumAppend(pAccum, zSpaces, N);
  }
}